

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

ostream * operator<<(ostream *os,BigInt *obj)

{
  pointer piVar1;
  long lVar2;
  
  if (obj->_isNegative == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"-",1);
  }
  piVar1 = (obj->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(obj->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) {
    lVar2 = 0;
    do {
      std::ostream::operator<<((ostream *)os,piVar1[lVar2]);
      lVar2 = lVar2 + 1;
      piVar1 = (obj->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar2 < (int)((ulong)((long)(obj->digits).super__Vector_base<int,_std::allocator<int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)piVar1)
                          >> 2));
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const BigInt &obj)
{
    if (obj.IsNegative()) {
        os << "-";
    }
    
    for (int i = 0; i < obj.getLength(); ++i) {
        os << obj[i];
    }
    
    return os;
}